

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<float,int,float,duckdb::BinaryStandardOperatorWrapper,duckdb::RoundOperatorPrecision,bool,true,false>
               (float *ldata,int *rdata,float *result_data,idx_t count,ValidityMask *mask,bool fun)

{
  int iVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  idx_t iVar10;
  ulong uVar11;
  ulong uVar12;
  float fVar13;
  float fVar14;
  float lentry;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      fVar14 = *ldata;
      dVar4 = (double)fVar14;
      iVar10 = 0;
      do {
        iVar1 = rdata[iVar10];
        if (iVar1 < 0) {
          dVar5 = pow(10.0,(double)-(float)iVar1);
          dVar6 = round(dVar4 / dVar5);
          dVar6 = dVar6 * dVar5;
          fVar13 = 0.0;
        }
        else {
          dVar5 = pow(10.0,(double)iVar1);
          dVar6 = round(dVar5 * dVar4);
          dVar6 = dVar6 / dVar5;
          fVar13 = fVar14;
        }
        if ((ulong)ABS(dVar6) < 0x7ff0000000000000) {
          fVar13 = (float)dVar6;
        }
        result_data[iVar10] = fVar13;
        iVar10 = iVar10 + 1;
      } while (count != iVar10);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar8 = 0;
    uVar11 = 0;
    do {
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar12 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar12 = count;
        }
LAB_01be8c79:
        uVar7 = uVar8;
        if (uVar8 < uVar12) {
          fVar14 = *ldata;
          dVar4 = (double)fVar14;
          do {
            iVar1 = rdata[uVar8];
            if (iVar1 < 0) {
              dVar5 = pow(10.0,(double)-(float)iVar1);
              dVar6 = round(dVar4 / dVar5);
              dVar6 = dVar6 * dVar5;
              fVar13 = 0.0;
            }
            else {
              dVar5 = pow(10.0,(double)iVar1);
              dVar6 = round(dVar5 * dVar4);
              dVar6 = dVar6 / dVar5;
              fVar13 = fVar14;
            }
            if ((ulong)ABS(dVar6) < 0x7ff0000000000000) {
              fVar13 = (float)dVar6;
            }
            result_data[uVar8] = fVar13;
            uVar8 = uVar8 + 1;
            uVar7 = uVar12;
          } while (uVar12 != uVar8);
        }
      }
      else {
        uVar3 = puVar2[uVar11];
        uVar12 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar12 = count;
        }
        uVar7 = uVar12;
        if (uVar3 != 0) {
          if (uVar3 == 0xffffffffffffffff) goto LAB_01be8c79;
          uVar7 = uVar8;
          if (uVar8 < uVar12) {
            uVar9 = 0;
            do {
              if ((uVar3 >> (uVar9 & 0x3f) & 1) != 0) {
                fVar14 = *ldata;
                iVar1 = rdata[uVar8 + uVar9];
                if (iVar1 < 0) {
                  dVar6 = pow(10.0,(double)-(float)iVar1);
                  dVar4 = round((double)fVar14 / dVar6);
                  dVar4 = dVar4 * dVar6;
                  fVar14 = 0.0;
                }
                else {
                  dVar6 = pow(10.0,(double)iVar1);
                  dVar4 = round((double)fVar14 * dVar6);
                  dVar4 = dVar4 / dVar6;
                }
                if ((ulong)ABS(dVar4) < 0x7ff0000000000000) {
                  fVar14 = (float)dVar4;
                }
                result_data[uVar8 + uVar9] = fVar14;
              }
              uVar9 = uVar9 + 1;
              uVar7 = uVar12;
            } while (uVar12 - uVar8 != uVar9);
          }
        }
      }
      uVar8 = uVar7;
      uVar11 = uVar11 + 1;
    } while (uVar11 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}